

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnSimdShuffleOpExpr
          (BinaryReaderIR *this,Opcode opcode,v128 value)

{
  Result RVar1;
  undefined1 local_40 [8];
  v128 value_local;
  _Head_base<0UL,_wabt::Expr_*,_false> _Stack_28;
  Opcode opcode_local;
  Expr *local_20;
  
  value_local.v._0_8_ = value.v._8_8_;
  local_40 = value.v._0_8_;
  value_local.v[3] = opcode.enum_;
  MakeUnique<wabt::SimdShuffleOpExpr,wabt::Opcode&,v128&>
            ((wabt *)&local_20,(Opcode *)(value_local.v + 3),(v128 *)local_40);
  _Stack_28._M_head_impl = local_20;
  local_20 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                          &stack0xffffffffffffffd8);
  if (_Stack_28._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)_Stack_28._M_head_impl + 8))();
  }
  if (local_20 != (Expr *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSimdShuffleOpExpr(Opcode opcode, v128 value) {
  return AppendExpr(MakeUnique<SimdShuffleOpExpr>(opcode, value));
}